

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O3

void putNewParticleIntoRep(Particle *particle,myRep *rep,int iterator)

{
  size_t *psVar1;
  int n;
  bool bVar2;
  _List_node_base *p_Var3;
  double **p2;
  ulong uVar4;
  long lVar5;
  double **p2_00;
  double **p2_01;
  Rep tmp;
  _List_node_base *local_60;
  _List_node_base *p_Stack_58;
  _List_node_base *local_50;
  int iStack_48;
  int iStack_44;
  ulong local_40;
  undefined8 local_38;
  
  lVar5 = 5;
  local_38 = 1;
  local_40 = 8;
  p2_00 = &particle->Position;
  p2 = &particle->addO_origin;
  p2_01 = &particle->Cost;
  do {
    if ((*(bool *)(p2_01 + 3) == false) && (bVar2 = canPutIntoRep(*p2_01,rep), bVar2)) {
      n = *(int *)(p2_01 + 5);
      uVar4 = (long)n * 8;
      if ((long)n < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      p_Stack_58 = (_List_node_base *)operator_new__(uVar4);
      uVar4 = (long)*(int *)((long)p2_01 + 0x2c) * 8;
      if ((long)*(int *)((long)p2_01 + 0x2c) < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      local_50 = (_List_node_base *)operator_new__(uVar4);
      local_60 = (_List_node_base *)operator_new__(local_40);
      iStack_48 = n;
      iStack_44 = iterator;
      cpyDoubleArray((double **)&p_Stack_58,p2,n);
      cpyDoubleArray((double **)&local_50,p2_00,*(int *)((long)p2_01 + 0x2c));
      cpyDoubleArray((double **)&local_60,p2_01,(int)local_38);
      p_Var3 = (_List_node_base *)operator_new(0x30);
      p_Var3[1]._M_next = local_60;
      p_Var3[1]._M_prev = p_Stack_58;
      p_Var3[2]._M_next = local_50;
      p_Var3[2]._M_prev = (_List_node_base *)CONCAT44(iStack_44,iStack_48);
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(rep->super__List_base<Rep,_std::allocator<Rep>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p2_00 = p2_00 + 0xf;
    p2 = p2 + 0xf;
    p2_01 = p2_01 + 0xf;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

void putNewParticleIntoRep(Particle * particle, myRep & rep, int iterator){
    for (int i=0; i<nPop; i++)
        if (!particle[i].dominated){
            if (canPutIntoRep(particle[i].Cost, rep)){
                Rep tmp;
                tmp.addO_origin = new double [particle[i].sizeOfAddO_origin];
                tmp.Position = new double [particle[i].sizeOfPosition];
                tmp.Cost = new double [numObjective];
                tmp.sizeOfAddO_origin = particle[i].sizeOfAddO_origin;
                tmp.iterator = iterator;
                cpyDoubleArray(tmp.addO_origin, particle[i].addO_origin, particle[i].sizeOfAddO_origin);
                cpyDoubleArray(tmp.Position, particle[i].Position, particle[i].sizeOfPosition);
                cpyDoubleArray(tmp.Cost, particle[i].Cost, numObjective);
                rep.push_back(tmp);
            }
        }
}